

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# videomenu.cpp
# Opt level: O3

void M_InitVideoModesMenu(void)

{
  IVideo *pIVar1;
  uint uVar2;
  int iVar3;
  int in_EDX;
  uint uVar4;
  ulong uVar5;
  int dummy2;
  int dummy1;
  undefined1 auStack_38 [4];
  undefined1 local_34 [4];
  
  BuildModesList(screen->VideoWidth,screen->VideoHeight,in_EDX);
  if (vid_tft.super_FBaseCVar.m_Callback != (_func_void_FBaseCVar_ptr *)0x0) {
    (*vid_tft.super_FBaseCVar.m_Callback)(&vid_tft.super_FBaseCVar);
  }
  uVar4 = 1;
  uVar5 = 0;
  do {
    pIVar1 = Video;
    uVar2 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x21])();
    (*pIVar1->_vptr_IVideo[5])(pIVar1,(ulong)uVar4,(ulong)(uVar2 & 0xff));
    iVar3 = (*Video->_vptr_IVideo[6])(Video,local_34,auStack_38,0);
    if ((char)iVar3 != '\0') {
      BitTranslate[uVar5] = (BYTE)uVar4;
      uVar5 = uVar5 + 1;
    }
  } while ((uVar4 < 0x20) && (uVar4 = uVar4 + 1, uVar5 < 0x20));
  return;
}

Assistant:

void M_RefreshModesList ()
{
	BuildModesList (screen->VideoWidth, screen->VideoHeight, DisplayBits);
}